

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_bea9::ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>::runTest
          (ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U> *this,bool writeMetadata)

{
  TextureWriterTestHelper<unsigned_char,_3U,_32849U> *this_00;
  internal iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  char *in_R9;
  ktxHashList *ppkVar11;
  KTX_header *pData;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxTexture1 *texture;
  ktx_uint8_t *ktxMemFile;
  ktx_size_t ktxMemFileLen;
  AssertHelper local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  AssertHelper local_50;
  ktx_error_code_e local_44;
  ktxTexture1 *local_40;
  KTX_header *local_38;
  undefined1 local_30 [8];
  
  local_40 = (ktxTexture1 *)0x0;
  local_44 = ktxTexture1_Create(&(this->helper).createInfo,1);
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_80._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_70,"result","KTX_SUCCESS",&local_44,(ktx_error_code_e *)&local_80);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x1d9,pcVar7);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  iVar1 = (internal)(local_40 != (ktxTexture1 *)0x0);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80._M_head_impl._0_1_ = iVar1;
  if (local_40 == (ktxTexture1 *)0x0) {
    testing::Message::Message((Message *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) + 0x10),
               "ktxTexture1_Create failed: ",0x1b);
    pcVar7 = (char *)ktxErrorString(local_44);
    lVar2 = CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_);
    if (pcVar7 == (char *)0x0) {
      sVar6 = 6;
      pcVar7 = "(null)";
    }
    else {
      sVar6 = strlen(pcVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar2 + 0x10),pcVar7,sVar6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_80,(AssertionResult *)0x17896e,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x1da,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
LAB_0012e298:
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) + 8))();
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    return;
  }
  this_00 = &this->helper;
  if (writeMetadata) {
    ppkVar11 = &local_40->kvDataHead;
    pcVar7 = (this->helper).super_WriterTestHelper<unsigned_char,_3U,_32849U>.orientation;
    sVar6 = strlen(pcVar7);
    ktxHashList_AddKVPair(ppkVar11,"KTXorientation",(int)sVar6 + 1,pcVar7);
  }
  local_44 = TextureWriterTestHelper<unsigned_char,_3U,_32849U>::copyImagesToTexture
                       (this_00,local_40);
  local_80._M_head_impl._0_1_ = (internal)(local_44 == KTX_SUCCESS);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_80._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_80,(AssertionResult *)"result == KTX_SUCCESS",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x1e3,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
    goto LAB_0012e298;
  }
  local_80._M_head_impl._0_1_ =
       (internal)
       TextureWriterTestHelper<unsigned_char,_3U,_32849U>::compareTexture1Images
                 (this_00,local_40->pData);
  local_88.data_._0_4_ = CONCAT31(local_88.data_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_70,"helper.compareTexture1Images(texture->pData)","true",
             (bool *)&local_80,(bool *)&local_88);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x1e5,pcVar7);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_44 = ktxTexture1_WriteToMemory(local_40,&local_38,local_30);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_44 != KTX_SUCCESS) {
    local_80._M_head_impl._0_1_ = (internal)(local_44 == KTX_SUCCESS);
    testing::Message::Message((Message *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) + 0x10),
               "ktxTexture_WriteToMemory failed: ",0x21);
    pcVar7 = (char *)ktxErrorString(local_44);
    lVar2 = CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_);
    if (pcVar7 == (char *)0x0) {
      sVar6 = 6;
      pcVar7 = "(null)";
    }
    else {
      sVar6 = strlen(pcVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar2 + 0x10),pcVar7,sVar6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_80,(AssertionResult *)"result == KTX_SUCCESS",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x1e8,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
    goto LAB_0012e298;
  }
  uVar9 = 0xab4b5458203131bb;
  uVar8 = *(ulong *)local_38->identifier;
  uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
          (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
          (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  if (uVar8 == 0xab4b5458203131bb) {
    uVar4 = *(uint *)(local_38->identifier + 8);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar8 = (ulong)uVar4;
    uVar10 = 0;
    if (uVar4 == 0xd0a1a0a) goto LAB_0012e1da;
    uVar9 = 0xd0a1a0a;
  }
  uVar10 = -(uint)(uVar8 < uVar9) | 1;
LAB_0012e1da:
  local_80._M_head_impl._0_4_ = uVar10;
  local_88.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_70,"memcmp(ktxMemFile, ktxId, sizeof(ktxId))","0",(int *)&local_80,
             (int *)&local_88);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x1ea,pcVar7);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  bVar3 = WriterTestHelper<unsigned_char,_3U,_32849U>::texinfo::compare
                    (&(this->helper).super_WriterTestHelper<unsigned_char,_3U,_32849U>.texinfo,
                     local_38);
  local_80._M_head_impl._0_1_ = (internal)bVar3;
  local_88.data_._0_4_ = CONCAT31(local_88.data_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_70,"helper.texinfo.compare((KTX_header*)ktxMemFile)","true",
             (bool *)&local_80,(bool *)&local_88);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x1eb,pcVar7);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  pData = local_38 + 1;
  if (writeMetadata) {
    iVar5 = memcmp(pData,(this->helper).super_WriterTestHelper<unsigned_char,_3U,_32849U>.kvData,
                   (ulong)(this->helper).super_WriterTestHelper<unsigned_char,_3U,_32849U>.kvDataLen
                  );
    local_80._M_head_impl._0_4_ = iVar5;
    local_88.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"memcmp(filePtr, helper.kvData, helper.kvDataLen)","0",
               (int *)&local_80,(int *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x1f0,pcVar7);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_80._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_80._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    pData = (KTX_header *)
            (pData->identifier +
            (this->helper).super_WriterTestHelper<unsigned_char,_3U,_32849U>.kvDataLen);
  }
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (ulong)((uint)pData & 3);
  local_88.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_70,"(intptr_t)filePtr & 0x3","0",(long *)&local_80,(int *)&local_88);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,500,pcVar7);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  bVar3 = WriterTestHelper<unsigned_char,_3U,_32849U>::compareRawImages
                    (&this_00->super_WriterTestHelper<unsigned_char,_3U,_32849U>,pData->identifier);
  local_80._M_head_impl._0_1_ = (internal)bVar3;
  local_88.data_._0_4_ = CONCAT31(local_88.data_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_70,"helper.compareRawImages(filePtr)","true",(bool *)&local_80,
             (bool *)&local_88);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x1f6,pcVar7);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  if (local_38 != (KTX_header *)0x0) {
    operator_delete(local_38,1);
  }
  ktxTexture1_Destroy(local_40);
  return;
}

Assistant:

void runTest(bool writeMetadata) {
        ktxTexture1* texture = 0;
        KTX_error_code result;
        ktx_uint8_t* ktxMemFile;
        ktx_size_t ktxMemFileLen;
        ktx_uint8_t* filePtr;

        result = ktxTexture1_Create(&helper.createInfo,
                                   KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                   &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                     << ktxErrorString(result);

        if (writeMetadata)
            ktxHashList_AddKVPair(&texture->kvDataHead, KTX_ORIENTATION_KEY,
                                  (unsigned int)strlen(helper.orientation) + 1,
                                  helper.orientation);

        result = helper.copyImagesToTexture(texture);
        ASSERT_TRUE(result == KTX_SUCCESS);

        EXPECT_EQ(helper.compareTexture1Images(texture->pData), true);
        result = ktxTexture1_WriteToMemory(texture, &ktxMemFile, &ktxMemFileLen);

        ASSERT_TRUE(result == KTX_SUCCESS) << "ktxTexture_WriteToMemory failed: "
                                           << ktxErrorString(result);
        EXPECT_EQ(memcmp(ktxMemFile, ktxId, sizeof(ktxId)), 0);
        EXPECT_EQ(helper.texinfo.compare((KTX_header*)ktxMemFile), true);

        // Check the metadata.
        filePtr = ktxMemFile + sizeof(KTX_header);
        if (writeMetadata) {
            EXPECT_EQ(memcmp(filePtr, helper.kvData, helper.kvDataLen), 0);
            filePtr += helper.kvDataLen;
        }
        // Check data pointer is properly aligned.
        EXPECT_EQ((intptr_t)filePtr & 0x3, 0);

        EXPECT_EQ(helper.compareRawImages(filePtr), true);

        delete ktxMemFile;
        ktxTexture1_Destroy(texture);
    }